

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O0

list_elem * list_pop_front(list *list)

{
  list_elem *e;
  list *list_local;
  list_elem *local_8;
  
  local_8 = list->head;
  if (local_8 == (list_elem *)0x0) {
    local_8 = (list_elem *)0x0;
  }
  else {
    if (local_8->next != (list_elem *)0x0) {
      local_8->next->prev = local_8->prev;
    }
    if (local_8->prev != (list_elem *)0x0) {
      local_8->prev->next = local_8->next;
    }
    if (list->head == local_8) {
      list->head = local_8->next;
    }
    if (list->tail == local_8) {
      list->tail = local_8->prev;
    }
  }
  return local_8;
}

Assistant:

struct list_elem *list_pop_front(struct list *list)
{
    IFDEF_LOCK( spin_lock(&list->lock); );
    struct list_elem *e = list->head;
    if (e) {
        // if not NULL
        if (e->next) e->next->prev = e->prev;
        if (e->prev) e->prev->next = e->next;

        if (list->head == e) list->head = e->next;
        if (list->tail == e) list->tail = e->prev;

        IFDEF_LOCK( spin_unlock(&list->lock); );
        return e;
    }
    // NULL .. do nothing
    IFDEF_LOCK( spin_unlock(&list->lock); );
    return NULL;
}